

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::EndObject
          (Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,SizeType memberCount)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  puVar1 = Stack<rapidjson::CrtAllocator>::Pop<unsigned_long>
                     (&this->stack_,(ulong)(memberCount * 2));
  uVar3 = 0x30000000519;
  for (uVar2 = 0; (ulong)memberCount * 2 != uVar2; uVar2 = uVar2 + 2) {
    uVar3 = uVar3 ^ (puVar1[uVar2 & 0xffffffff] * 0x100000001b3 ^ puVar1[(int)uVar2 + 1]) *
                    0x100000001b3;
  }
  puVar1 = Stack<rapidjson::CrtAllocator>::Push<unsigned_long>(&this->stack_,1);
  *puVar1 = uVar3;
  return true;
}

Assistant:

bool EndObject(SizeType memberCount) { 
        uint64_t h = Hash(0, kObjectType);
        uint64_t* kv = stack_.template Pop<uint64_t>(memberCount * 2);
        for (SizeType i = 0; i < memberCount; i++)
            // Issue #2205
            // Hasing the key to avoid key=value cases with bug-prone zero-value hash
            h ^= Hash(Hash(0, kv[i * 2]), kv[i * 2 + 1]);  // Use xor to achieve member order insensitive
        *stack_.template Push<uint64_t>() = h;
        return true;
    }